

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O3

LengthPercentage
Rml::ComputeMaxSize(Property *property,float font_size,float document_font_size,float dp_ratio,
                   Vector2f vp_dimensions)

{
  NumericValue value;
  ulong uVar1;
  float fVar2;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float local_1c;
  undefined1 local_18 [16];
  
  if ((property->unit & KEYWORD) == UNKNOWN) {
    if ((property->unit & PERCENT) != UNKNOWN) {
      local_1c = 0.0;
      Variant::GetInto<float,_0>(&property->value,&local_1c);
      uVar1 = 1;
      goto LAB_001e58e8;
    }
    local_18._8_4_ = in_XMM3_Dc;
    local_18._0_8_ = vp_dimensions;
    local_18._12_4_ = in_XMM3_Dd;
    value = Property::GetNumericValue(property);
    fVar2 = ComputeLength(value,font_size,document_font_size,dp_ratio,(Vector2f)local_18._0_8_);
    local_1c = (float)(-(uint)(fVar2 < 0.0) & 0x7f7fffff | ~-(uint)(fVar2 < 0.0) & (uint)fVar2);
  }
  else {
    local_1c = 3.4028235e+38;
  }
  uVar1 = 0;
LAB_001e58e8:
  return (LengthPercentage)((ulong)(uint)local_1c << 0x20 | uVar1);
}

Assistant:

Style::LengthPercentage ComputeMaxSize(const Property* property, float font_size, float document_font_size, float dp_ratio, Vector2f vp_dimensions)
{
	using namespace Style;
	if (Any(property->unit & Unit::KEYWORD))
		return LengthPercentage(LengthPercentage::Length, FLT_MAX);
	else if (Any(property->unit & Unit::PERCENT))
		return LengthPercentage(LengthPercentage::Percentage, property->Get<float>());

	const float length = ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions);
	return LengthPercentage(LengthPercentage::Length, length < 0.f ? FLT_MAX : length);
}